

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status
fdb_compact_file(fdb_file_handle *fhandle,char *new_filename,bool in_place_compaction,
                bid_t marker_bid,bool clone_docs,fdb_encryption_key *new_encryption_key,
                fdb_compact_opt *compact_opt)

{
  byte bVar1;
  bool bVar2;
  fdb_status fVar3;
  filemgr *doc_handle;
  void *__ptr;
  btree_kv_ops *pbVar4;
  hbtrie *trie;
  hbtrie_cmp_map *map_func;
  filemgr_magic_t magic;
  hbtrie *in_RCX;
  byte in_DL;
  byte bVar5;
  fdb_status fVar6;
  btreeblk_handle *in_RSI;
  filemgr *in_RDI;
  byte in_R8B;
  void *in_R9;
  filemgr_open_result fVar7;
  btree *in_stack_00000030;
  btree_kv_ops *stale_kv_ops;
  filemgr_open_result result;
  fdb_compact_opt *in_stack_00000050;
  fdb_status status;
  fdb_kvs_handle *handle;
  hbtrie *new_seqtrie;
  btree *new_staletree;
  btree *old_seqtree;
  btree *new_seqtree;
  hbtrie *new_trie;
  docio_handle *new_dhandle;
  btreeblk_handle *new_bhandle;
  filemgr_config fconfig;
  filemgr *new_file;
  err_log_callback *in_stack_00000278;
  filemgr_config *in_stack_00000280;
  filemgr_ops *in_stack_00000288;
  char *in_stack_00000290;
  fdb_kvs_handle *in_stack_fffffffffffffeb8;
  undefined1 in_place_compaction_00;
  filemgr *in_stack_fffffffffffffec0;
  uint32_t nodesize;
  btree_kv_ops *kv_ops;
  filemgr *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  btree_blk_ops *in_stack_fffffffffffffed8;
  hbtrie *in_stack_fffffffffffffee0;
  void *in_stack_fffffffffffffee8;
  filemgr *in_stack_fffffffffffffef0;
  uint8_t vsize;
  undefined4 in_stack_ffffffffffffff04;
  bnode_flag_t in_stack_ffffffffffffff08;
  btree_meta *meta;
  fdb_kvs_handle *in_stack_ffffffffffffff68;
  undefined1 auStack_8c [60];
  filemgr *local_50;
  undefined1 clone_docs_00;
  undefined7 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  bVar5 = in_DL & 1;
  bVar1 = in_R8B & 1;
  meta = (btree_meta *)in_RDI->filename;
  filemgr_mutex_lock((filemgr *)0x15ca8d);
  fVar3 = _fdb_compact_file_checks(in_stack_fffffffffffffeb8,(char *)0x15ca9f);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fdb_sync_db_header(in_stack_ffffffffffffff68);
    _fdb_init_file_config
              ((fdb_config *)in_stack_fffffffffffffec0,(filemgr_config *)in_stack_fffffffffffffeb8);
    in_place_compaction_00 = (undefined1)((ulong)in_stack_fffffffffffffeb8 >> 0x38);
    if (in_R9 != (void *)0x0) {
      memcpy(auStack_8c,in_R9,0x24);
    }
    clone_docs_00 = (undefined1)((ulong)in_R9 >> 0x38);
    fVar7 = filemgr_open(in_stack_00000290,in_stack_00000288,in_stack_00000280,in_stack_00000278);
    doc_handle = fVar7.file;
    fVar6 = fVar7.rv;
    if (fVar6 == FDB_RESULT_SUCCESS) {
      local_50 = doc_handle;
      if (doc_handle == (filemgr *)0x0) {
        filemgr_mutex_unlock((filemgr *)0x15cba1);
        fVar3 = FDB_RESULT_OPEN_FAIL;
      }
      else {
        filemgr_fhandle_add(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        filemgr_set_in_place_compaction(in_stack_fffffffffffffec0,(bool)in_place_compaction_00);
        nodesize = (uint32_t)((ulong)in_stack_fffffffffffffec0 >> 0x20);
        filemgr_mutex_lock((filemgr *)0x15cbed);
        __ptr = calloc(1,0x78);
        *(void ***)((long)__ptr + 0x40) = &meta[0x16].data;
        pbVar4 = (btree_kv_ops *)calloc(1,0x40);
        pbVar4->init_kv_var = (btree_print_func *)&meta[0x16].data;
        fVar3 = docio_init((docio_handle *)in_stack_fffffffffffffed8,
                           (filemgr *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                           SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0));
        if (fVar3 == FDB_RESULT_SUCCESS) {
          btreeblk_init((btreeblk_handle *)
                        CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        in_stack_fffffffffffffec8,nodesize);
          trie = (hbtrie *)malloc(0x70);
          kv_ops = pbVar4;
          hbtrie_init(in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                      (int)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,0x14f220,pbVar4,
                      (btree_blk_ops *)in_stack_fffffffffffffef0,doc_handle,
                      (hbtrie_func_readkey *)CONCAT44(in_stack_ffffffffffffff04,fVar6));
          hbtrie_set_leaf_cmp(trie,_fdb_custom_cmp_wrap);
          trie->flag = *(uint8_t *)(*(long *)(meta + 3) + 2);
          trie->leaf_height_limit = *(uint8_t *)(*(long *)(meta + 3) + 3);
          map_func = hbtrie_get_map_function(*(hbtrie **)(meta + 3));
          hbtrie_set_map_function(trie,map_func);
          if ((char)meta[9].size == '\x01') {
            if (meta[1].data == (void *)0x0) {
              calloc(1,0x38);
              kv_ops = (btree_kv_ops *)((ulong)kv_ops & 0xffffffff00000000);
              btree_init((btree *)trie,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                         (btree_kv_ops *)
                         CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),0,'\0',
                         (uint8_t)fVar6,in_stack_ffffffffffffff08,meta);
            }
            else {
              calloc(1,0x70);
              hbtrie_init(in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                          (int)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,0x14f3f0,pbVar4,
                          (btree_blk_ops *)in_stack_fffffffffffffef0,doc_handle,
                          (hbtrie_func_readkey *)CONCAT44(in_stack_ffffffffffffff04,fVar6));
              kv_ops = pbVar4;
            }
          }
          vsize = (uint8_t)fVar6;
          magic = ver_get_latest_magic();
          bVar2 = ver_staletree_support(magic);
          if (bVar2) {
            if (meta[3].data == (void *)0x0) {
              calloc(1,0x78);
              pbVar4 = btree_kv_get_kb64_vb64(kv_ops);
              pbVar4->cmp = _cmp_uint64_t_endian_safe;
            }
            calloc(1,0x38);
            btree_init((btree *)trie,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                       (btree_kv_ops *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
                       ,0,'\0',vsize,in_stack_ffffffffffffff08,meta);
          }
          fVar3 = _fdb_compact_file((fdb_kvs_handle *)
                                    CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                                    in_RDI,in_RSI,
                                    (docio_handle *)CONCAT17(bVar5,in_stack_ffffffffffffffd0),in_RCX
                                    ,(hbtrie *)CONCAT17(bVar1,in_stack_ffffffffffffffc0),
                                    in_stack_00000030,(btree *)stale_kv_ops,(bid_t)result.file,
                                    (bool)clone_docs_00,in_stack_00000050);
        }
        else {
          free(__ptr);
          free(pbVar4);
          filemgr_mutex_unlock((filemgr *)0x15cca2);
        }
      }
    }
    else {
      filemgr_mutex_unlock((filemgr *)0x15cb6b);
      fVar3 = fVar6;
    }
  }
  else {
    filemgr_mutex_unlock((filemgr *)0x15cab8);
  }
  return fVar3;
}

Assistant:

fdb_status fdb_compact_file(fdb_file_handle *fhandle,
                            const char *new_filename,
                            bool in_place_compaction,
                            bid_t marker_bid,
                            bool clone_docs,
                            const fdb_encryption_key *new_encryption_key,
                            const fdb_compact_opt* compact_opt)
{
    struct filemgr *new_file;
    struct filemgr_config fconfig;
    struct btreeblk_handle *new_bhandle;
    struct docio_handle *new_dhandle;
    struct hbtrie *new_trie = NULL;
    struct btree *new_seqtree = NULL, *old_seqtree;
    struct btree *new_staletree = NULL;
    struct hbtrie *new_seqtrie = NULL;
    fdb_kvs_handle *handle = fhandle->root;
    fdb_status status;
    LATENCY_STAT_START();

    // prevent update to the target file
    filemgr_mutex_lock(handle->file);

    status = _fdb_compact_file_checks(handle, new_filename);
    if (status != FDB_RESULT_SUCCESS) {
        filemgr_mutex_unlock(handle->file);
        return status;
    }

    // sync handle
    fdb_sync_db_header(handle);

    // set filemgr configuration
    _fdb_init_file_config(&handle->config, &fconfig);
    fconfig.options |= FILEMGR_CREATE;
    if (new_encryption_key) {
        fconfig.encryption_key = *new_encryption_key;
    }

    // open new file
    filemgr_open_result result = filemgr_open((char *)new_filename,
                                              handle->fileops,
                                              &fconfig,
                                              &handle->log_callback);
    if (result.rv != FDB_RESULT_SUCCESS) {
        filemgr_mutex_unlock(handle->file);
        return (fdb_status) result.rv;
    }

    new_file = result.file;

    if (new_file == NULL) {
        filemgr_mutex_unlock(handle->file);
        return FDB_RESULT_OPEN_FAIL;
    }

    filemgr_fhandle_add(new_file, handle->fhandle);

    filemgr_set_in_place_compaction(new_file, in_place_compaction);
    // prevent update to the new_file
    filemgr_mutex_lock(new_file);

    // create new hb-trie and related handles
    new_bhandle = (struct btreeblk_handle *)calloc(1, sizeof(struct btreeblk_handle));
    new_bhandle->log_callback = &handle->log_callback;
    new_dhandle = (struct docio_handle *)calloc(1, sizeof(struct docio_handle));
    new_dhandle->log_callback = &handle->log_callback;

    status = docio_init(new_dhandle, new_file,
                        handle->config.compress_document_body);
    if (status != FDB_RESULT_SUCCESS) {
        free(new_bhandle);
        free(new_dhandle);
        filemgr_mutex_unlock(new_file);
        return status;
    }

    btreeblk_init(new_bhandle, new_file, new_file->blocksize);

    new_trie = (struct hbtrie *)malloc(sizeof(struct hbtrie));
    hbtrie_init(new_trie, handle->trie->chunksize, handle->trie->valuelen,
                new_file->blocksize, BLK_NOT_FOUND,
                (void *)new_bhandle, handle->btreeblkops,
                (void*)new_dhandle, _fdb_readkey_wrap);

    hbtrie_set_leaf_cmp(new_trie, _fdb_custom_cmp_wrap);
    // set aux
    new_trie->flag = handle->trie->flag;
    new_trie->leaf_height_limit = handle->trie->leaf_height_limit;
    hbtrie_set_map_function(new_trie, hbtrie_get_map_function(handle->trie));

    if (handle->config.seqtree_opt == FDB_SEQTREE_USE) {
        // if we use sequence number tree
        if (handle->kvs) { // multi KV instance mode
            new_seqtrie = (struct hbtrie *)calloc(1, sizeof(struct hbtrie));

            hbtrie_init(new_seqtrie, sizeof(fdb_kvs_id_t),
                        OFFSET_SIZE, new_file->blocksize, BLK_NOT_FOUND,
                        (void *)new_bhandle, handle->btreeblkops,
                        (void *)new_dhandle, _fdb_readseq_wrap);
        } else {
            new_seqtree = (struct btree *)calloc(1, sizeof(struct btree));
            old_seqtree = handle->seqtree;

            btree_init(new_seqtree, (void *)new_bhandle,
                       old_seqtree->blk_ops, old_seqtree->kv_ops,
                       old_seqtree->blksize, old_seqtree->ksize,
                       old_seqtree->vsize, 0x0, NULL);
        }
    }

    // stale-block tree
    if (ver_staletree_support(ver_get_latest_magic())) {
        struct btree_kv_ops *stale_kv_ops;
        if (handle->staletree) {
            stale_kv_ops = handle->staletree->kv_ops;
        } else {
            // this happens when the old file's version is older than MAGIC_002.
            stale_kv_ops = (struct btree_kv_ops*)calloc(1, sizeof(struct btree_kv_ops));
            stale_kv_ops = btree_kv_get_kb64_vb64(stale_kv_ops);
            stale_kv_ops->cmp = _cmp_uint64_t_endian_safe;
        }

        new_staletree = (struct btree*)calloc(1, sizeof(struct btree));
        btree_init(new_staletree, (void *)new_bhandle,
                   handle->btreeblkops, stale_kv_ops,
                   handle->config.blocksize, sizeof(filemgr_header_revnum_t),
                   OFFSET_SIZE, 0x0, NULL);
    } else {
        new_staletree = NULL;
    }

    status = _fdb_compact_file(handle, new_file, new_bhandle, new_dhandle,
                               new_trie, new_seqtrie, new_seqtree, new_staletree,
                               marker_bid, clone_docs, compact_opt);
    LATENCY_STAT_END(fhandle->root->file, FDB_LATENCY_COMPACTS);

    return status;
}